

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlDrawVertexArrayElementsInstanced(int offset,int count,void *buffer,int instances)

{
  ulong uVar1;
  unsigned_short *bufferPtr;
  
  uVar1 = 0;
  if (0 < offset) {
    uVar1 = (ulong)(uint)offset;
  }
  (*glad_glDrawElementsInstanced)(4,count,0x1403,(void *)((long)buffer + uVar1 * 2),instances);
  return;
}

Assistant:

void rlDrawVertexArrayElementsInstanced(int offset, int count, const void *buffer, int instances)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // NOTE: Added pointer math separately from function to avoid UBSAN complaining
    unsigned short *bufferPtr = (unsigned short *)buffer;
    if (offset > 0) bufferPtr += offset;

    glDrawElementsInstanced(GL_TRIANGLES, count, GL_UNSIGNED_SHORT, (const unsigned short *)bufferPtr, instances);
#endif
}